

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O1

void __thiscall slang::ast::SystemTimingCheckSymbol::resolve(SystemTimingCheckSymbol *this)

{
  SyntaxKind SVar1;
  Scope *pSVar2;
  Compilation *pCVar3;
  Scope *pSVar4;
  SystemTimingCheckDef *pSVar5;
  Type *pTVar6;
  SyntaxNode *this_00;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar7;
  logic_t lVar8;
  int iVar9;
  ulong uVar10;
  Diagnostic *pDVar11;
  undefined4 extraout_var;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar12;
  undefined4 extraout_var_00;
  SourceLocation SVar13;
  Expression *pEVar14;
  undefined4 extraout_var_01;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar15;
  variant_alternative_t<2UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar16;
  variant_alternative_t<3UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar17;
  undefined4 extraout_var_02;
  size_t __n;
  size_t __n_00;
  undefined4 extraout_var_03;
  EVP_PKEY_CTX *pEVar18;
  size_t extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  EVP_PKEY_CTX *extraout_RDX_07;
  EVP_PKEY_CTX *extraout_RDX_08;
  Info *extraout_RDX_09;
  EVP_PKEY_CTX *extraout_RDX_10;
  EVP_PKEY_CTX *extraout_RDX_11;
  EVP_PKEY_CTX *extraout_RDX_12;
  EVP_PKEY_CTX *extraout_RDX_13;
  EVP_PKEY_CTX *extraout_RDX_14;
  EVP_PKEY_CTX *extraout_RDX_15;
  EVP_PKEY_CTX *extraout_RDX_16;
  pointer pSVar19;
  DiagCode code;
  long lVar20;
  SyntaxNode *pSVar21;
  byte *pbVar22;
  SyntaxNode *pSVar23;
  LookupLocation LVar24;
  SourceRange SVar25;
  string_view sVar26;
  string_view sVar27;
  EdgeDescriptor desc;
  EdgeKind edge;
  SmallVector<std::array<char,_2UL>,_20UL> edgeDescriptors;
  ASTContext context;
  Expression *condition;
  SmallVector<slang::ast::SystemTimingCheckSymbol::Arg,_2UL> argBuf;
  Token local_188;
  Compilation *local_178;
  EdgeKind local_16c;
  undefined1 local_168 [24];
  undefined8 uStack_150;
  TempVarSymbol *local_148;
  RandomizeDetails *pRStack_140;
  AssertionInstanceDetails *local_138;
  ASTContext local_128;
  Scope *local_f0;
  SyntaxNode *local_e8;
  ulong local_e0;
  Expression *local_d8;
  Token *local_d0;
  SystemTimingCheckSymbol *local_c8;
  SyntaxNode *local_c0;
  SyntaxNode *local_b8;
  Expression *local_b0;
  ulong local_a8;
  SystemTimingCheckDef *local_a0;
  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> local_98;
  
  this->isResolved = true;
  if (this->def != (SystemTimingCheckDef *)0x0) {
    pSVar2 = (this->super_Symbol).parentScope;
    pSVar21 = (this->super_Symbol).originatingSyntax;
    pCVar3 = pSVar2->compilation;
    pSVar4 = pSVar2->thisSym->parentScope;
    LVar24 = LookupLocation::after(&this->super_Symbol);
    pEVar18 = LVar24._8_8_;
    local_128.lookupIndex = LVar24.index;
    local_128.flags.m_bits = 0x400000020;
    local_128.instanceOrProc = (Symbol *)0x0;
    local_128.firstTempVar = (TempVarSymbol *)0x0;
    local_128.randomizeDetails = (RandomizeDetails *)0x0;
    local_128.assertionInstance = (AssertionInstanceDetails *)0x0;
    pSVar5 = this->def;
    uVar10 = (ulong)((long)&(pSVar21[6].previewNode)->kind + 1) >> 1;
    local_128.scope.ptr = pSVar2;
    if (uVar10 < pSVar5->minArgs) {
      SVar25 = slang::syntax::SyntaxNode::sourceRange(pSVar21);
      pDVar11 = ASTContext::addDiag(&local_128,(DiagCode)0x9f0007,SVar25);
      sVar26 = parsing::Token::valueText((Token *)&pSVar21[3].parent);
      Diagnostic::operator<<(pDVar11,sVar26);
      local_98.data_ = (pointer)this->def->minArgs;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar11->args,(unsigned_long *)&local_98);
      pSVar21 = pSVar21[6].previewNode;
    }
    else {
      if (uVar10 <= (ulong)((long)(pSVar5->args).
                                  super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pSVar5->args).
                                  super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4)) {
        local_98.data_ = (pointer)local_98.firstElement;
        local_98.len = 0;
        local_98.cap = 2;
        local_178 = pCVar3;
        local_f0 = pSVar4;
        local_a0 = pSVar5;
        if ((byte *)0x1 < (byte *)((long)&(pSVar21[6].previewNode)->kind + 1)) {
          local_d0 = (Token *)&pSVar21[3].parent;
          uVar10 = 0;
          local_c8 = this;
          local_c0 = pSVar21;
          do {
            pSVar19 = (local_a0->args).
                      super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar10;
            local_e0 = uVar10;
            ppSVar12 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                 ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   *)(pSVar21[6].parent + uVar10 * 2));
            pSVar23 = *ppSVar12;
            SVar1 = pSVar23->kind;
            if (SVar1 == TimingCheckEventArg) {
              if (pSVar19->kind == Event) goto LAB_0023bbea;
              SVar25 = slang::syntax::SyntaxNode::sourceRange(pSVar23);
              code.subsystem = Declarations;
              code.code = 0xc6;
LAB_0023bbaa:
              ASTContext::addDiag(&local_128,code,SVar25);
LAB_0023bbb7:
              SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplace_back<>(&local_98);
              pEVar18 = extraout_RDX_01;
            }
            else {
              if (SVar1 == EmptyTimingCheckArg) {
                if (local_e0 < this->def->minArgs) {
                  ppSVar12 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         *)(pSVar21[6].parent + uVar10 * 2));
                  SVar25 = slang::syntax::SyntaxNode::sourceRange(*ppSVar12);
                  code.subsystem = Expressions;
                  code.code = 0x4d;
                  goto LAB_0023bbaa;
                }
                goto LAB_0023bbb7;
              }
LAB_0023bbea:
              pEVar18 = extraout_RDX_00;
              switch(pSVar19->kind) {
              case Event:
                if (SVar1 == ExpressionTimingCheckArg) {
                  pEVar14 = bindTerminal(*(ExpressionSyntax **)(pSVar23 + 1),Both,local_f0,
                                         &local_128);
                  if (pEVar14 == (Expression *)0x0) {
                    SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplace_back<>
                              (&local_98);
                    pEVar18 = extraout_RDX_14;
                  }
                  else {
                    SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
                    emplace_back<slang::ast::Expression_const&>(&local_98,pEVar14);
                    pEVar18 = extraout_RDX_02;
                  }
                }
                else {
                  pEVar14 = bindTerminal(*(ExpressionSyntax **)(pSVar23 + 2),Both,local_f0,
                                         &local_128);
                  local_d8 = (Expression *)0x0;
                  if (pSVar23[2].parent != (SyntaxNode *)0x0) {
                    iVar9 = Expression::bind((int)pSVar23[2].parent[1].previewNode,
                                             (sockaddr *)&local_128,0);
                    local_d8 = (Expression *)CONCAT44(extraout_var_02,iVar9);
                    ASTContext::requireBooleanConvertible(&local_128,local_d8);
                  }
                  local_b0 = pEVar14;
                  local_16c = SemanticFacts::getEdgeKind((TokenKind)pSVar23[1].kind);
                  local_168._8_8_ = 0;
                  local_168._0_8_ = &uStack_150;
                  local_168._16_8_ = 0x14;
                  local_e8 = pSVar23[1].previewNode;
                  pEVar18 = extraout_RDX_07;
                  local_b8 = pSVar23;
                  if ((local_e8 != (SyntaxNode *)0x0) &&
                     (pbVar22 = (byte *)((long)&(local_e8[3].previewNode)->kind + 1),
                     (byte *)0x1 < pbVar22)) {
                    uVar10 = (ulong)pbVar22 >> 1;
                    lVar20 = 0;
                    do {
                      ppSVar12 = std::
                                 get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                             *)((long)&(local_e8[3].parent)->kind + lVar20));
                      pSVar7 = *ppSVar12;
                      local_a8 = uVar10;
                      sVar26 = parsing::Token::rawText((Token *)(pSVar7 + 1));
                      __n = sVar26._M_len;
                      sVar27 = parsing::Token::rawText((Token *)&pSVar7[1].previewNode);
                      pEVar18 = (EVP_PKEY_CTX *)sVar27._M_str;
                      __n_00 = sVar27._M_len;
                      if (__n_00 + __n == 2) {
                        memcpy(&local_188,sVar26._M_str,__n);
                        if (__n_00 != 0) {
                          memcpy((void *)((long)&local_188.kind + __n),pEVar18,__n_00);
                        }
                        SmallVectorBase<std::array<char,2ul>>::
                        emplace_back<std::array<char,2ul>const&>
                                  ((SmallVectorBase<std::array<char,2ul>> *)local_168,
                                   (array<char,_2UL> *)&local_188);
                        pEVar18 = extraout_RDX_08;
                      }
                      lVar20 = lVar20 + 0x30;
                      uVar10 = local_a8 - 1;
                    } while (uVar10 != 0);
                  }
                  iVar9 = SmallVectorBase<std::array<char,_2UL>_>::copy
                                    ((SmallVectorBase<std::array<char,_2UL>_> *)local_168,
                                     (EVP_PKEY_CTX *)local_178,pEVar18);
                  local_188.rawLen = extraout_var_03;
                  local_188.kind = (short)iVar9;
                  local_188._2_1_ = (char)((uint)iVar9 >> 0x10);
                  local_188.numFlags.raw = (char)((uint)iVar9 >> 0x18);
                  local_188.info = extraout_RDX_09;
                  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
                  emplace_back<slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::ast::EdgeKind&,std::span<std::array<char,2ul>,18446744073709551615ul>>
                            (&local_98,local_b0,&local_d8,&local_16c,
                             (span<std::array<char,_2UL>,_18446744073709551615UL> *)&local_188);
                  pSVar23 = local_b8;
                  pSVar21 = local_c0;
                  this = local_c8;
                  pEVar18 = extraout_RDX_10;
                  if ((undefined8 *)local_168._0_8_ != &uStack_150) {
                    operator_delete((void *)local_168._0_8_);
                    pEVar18 = extraout_RDX_11;
                  }
                }
                if (pSVar19->requireEdge == true) {
                  pEVar18 = (EVP_PKEY_CTX *)(local_98.len * 5);
                  if (local_98.data_[local_98.len - 1].expr != (Expression *)0x0) {
                    if (local_98.data_[local_98.len - 1].edge == None) {
                      pDVar11 = ASTContext::addDiag(&local_128,(DiagCode)0xc50006,
                                                    (local_98.data_[local_98.len - 1].expr)->
                                                    sourceRange);
                      sVar26 = parsing::Token::valueText(local_d0);
                      Diagnostic::operator<<(pDVar11,sVar26);
                      pEVar18 = extraout_RDX_16;
                    }
                    else if ((local_98.data_[local_98.len - 1].edge == BothEdges) &&
                            (this->def->kind == NoChange)) {
                      SVar25 = parsing::Token::range((Token *)(pSVar23 + 1));
                      ASTContext::addDiag(&local_128,(DiagCode)0x8a0006,SVar25);
                      pEVar18 = extraout_RDX_15;
                    }
                  }
                }
                break;
              case Notifier:
                this_00 = *(SyntaxNode **)(pSVar23 + 1);
                if (this_00->kind == IdentifierName) {
                  local_168._12_4_ = local_128._12_4_;
                  local_168._8_4_ = local_128.lookupIndex;
                  uStack_150 = local_128.instanceOrProc;
                  local_138 = local_128.assertionInstance;
                  local_148 = local_128.firstTempVar;
                  pRStack_140 = local_128.randomizeDetails;
                  local_168._0_8_ = local_128.scope.ptr;
                  local_168._16_8_ = local_128.flags.m_bits & 0x1fffffffffdf;
                  pTVar6 = local_178->logicType;
                  local_188 = slang::syntax::SyntaxNode::getFirstToken(this_00);
                  SVar13 = parsing::Token::location(&local_188);
                  pEVar14 = Expression::bindLValue
                                      ((ExpressionSyntax *)this_00,pTVar6,SVar13,
                                       (ASTContext *)local_168,false);
                  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
                  emplace_back<slang::ast::Expression_const&>(&local_98,pEVar14);
                  pEVar18 = extraout_RDX_06;
                }
                else {
                  SVar25 = slang::syntax::SyntaxNode::sourceRange(pSVar23);
                  ASTContext::addDiag(&local_128,(DiagCode)0x680006,SVar25);
                  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplace_back<>
                            (&local_98);
                  pEVar18 = extraout_RDX_12;
                }
                break;
              case DelayedRef:
                if (local_98.data_[pSVar19->signalRef].expr == (Expression *)0x0) {
                  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplace_back<>
                            (&local_98);
                  pEVar18 = extraout_RDX_13;
                }
                else {
                  pSVar23 = *(SyntaxNode **)(pSVar23 + 1);
                  pTVar6 = ((local_98.data_[pSVar19->signalRef].expr)->type).ptr;
                  local_168._0_16_ =
                       (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(pSVar23);
                  SVar13 = parsing::Token::location((Token *)local_168);
                  pEVar14 = Expression::bindLValue
                                      ((ExpressionSyntax *)pSVar23,pTVar6,SVar13,&local_128,false);
                  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
                  emplace_back<slang::ast::Expression_const&>(&local_98,pEVar14);
                  pEVar18 = extraout_RDX_04;
                }
                break;
              case Limit:
                iVar9 = Expression::bind((int)*(undefined8 *)(pSVar23 + 1),(sockaddr *)&local_128,0)
                ;
                pEVar14 = (Expression *)CONCAT44(extraout_var_01,iVar9);
                SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
                emplace_back<slang::ast::Expression_const&>(&local_98,pEVar14);
                ASTContext::eval((ConstantValue *)local_168,&local_128,pEVar14,
                                 (bitmask<slang::ast::EvalFlags>)0x0);
                if (((__index_type)local_148 != '\0') && (pSVar19->requirePositive == true)) {
                  if (((__index_type)local_148 == '\x01') &&
                     (pvVar15 = std::
                                get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                          ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                            *)local_168),
                     (pvVar15->super_SVIntStorage).signFlag == true)) {
                    pvVar15 = std::
                              get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                        ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                          *)local_168);
                    lVar8 = SVInt::operator[](pvVar15,(pvVar15->super_SVIntStorage).bitWidth - 1);
                    if (((lVar8.value == '\0') || (lVar8.value == 0x80)) || (lVar8.value == '@'))
                    goto LAB_0023bd79;
                  }
                  else {
LAB_0023bd79:
                    if ((((__index_type)local_148 != '\x02') ||
                        (pvVar16 = std::
                                   get<2ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                             ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                               *)local_168), 0.0 < pvVar16->v || pvVar16->v == 0.0))
                       && (((__index_type)local_148 != '\x03' ||
                           (pvVar17 = std::
                                      get<3ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                                ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                                  *)local_168),
                           0.0 < pvVar17->v || pvVar17->v == 0.0)))) goto LAB_0023bdd2;
                  }
                  pDVar11 = ASTContext::addDiag(&local_128,(DiagCode)0xca0007,pEVar14->sourceRange);
                  Diagnostic::operator<<(pDVar11,(ConstantValue *)local_168);
                }
LAB_0023bdd2:
                std::__detail::__variant::
                _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                     *)local_168);
                pEVar18 = extraout_RDX_05;
                break;
              case Condition:
                iVar9 = Expression::bind((int)*(undefined8 *)(pSVar23 + 1),(sockaddr *)&local_128,0)
                ;
                ASTContext::requireBooleanConvertible
                          (&local_128,(Expression *)CONCAT44(extraout_var_00,iVar9));
                SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
                emplace_back<slang::ast::Expression_const&>
                          (&local_98,(Expression *)CONCAT44(extraout_var_00,iVar9));
                pEVar18 = extraout_RDX_03;
              }
            }
            uVar10 = local_e0 + 1;
          } while (uVar10 < (ulong)((long)&(pSVar21[6].previewNode)->kind + 1) >> 1);
        }
        iVar9 = SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::copy
                          (&local_98,(EVP_PKEY_CTX *)local_178,pEVar18);
        (this->args)._M_ptr = (pointer)CONCAT44(extraout_var,iVar9);
        (this->args)._M_extent._M_extent_value = extraout_RDX;
        if (local_98.data_ == (pointer)local_98.firstElement) {
          return;
        }
        operator_delete(local_98.data_);
        return;
      }
      SVar25 = slang::syntax::SyntaxNode::sourceRange(pSVar21);
      pDVar11 = ASTContext::addDiag(&local_128,(DiagCode)0xa00007,SVar25);
      sVar26 = parsing::Token::valueText((Token *)&pSVar21[3].parent);
      Diagnostic::operator<<(pDVar11,sVar26);
      local_98.data_ =
           (pointer)((long)(pSVar5->args).
                           super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pSVar5->args).
                           super__Vector_base<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar11->args,(unsigned_long *)&local_98);
      pSVar21 = pSVar21[6].previewNode;
    }
    local_98.data_ = (pointer)((ulong)((long)&pSVar21->kind + 1) >> 1);
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::emplace_back<unsigned_long>(&pDVar11->args,(unsigned_long *)&local_98);
  }
  return;
}

Assistant:

void SystemTimingCheckSymbol::resolve() const {
    isResolved = true;
    if (!def)
        return;

    auto syntaxPtr = getSyntax();
    auto parent = getParentScope();
    SLANG_ASSERT(syntaxPtr && parent);

    auto parentParent = parent->asSymbol().getParentScope();
    auto& comp = parent->getCompilation();
    ASTContext context(*parent, LookupLocation::after(*this),
                       ASTFlags::NonProcedural | ASTFlags::SpecifyBlock);

    auto& syntax = syntaxPtr->as<SystemTimingCheckSyntax>();
    auto& actualArgs = syntax.args;
    auto& formalArgs = def->args;

    if (actualArgs.size() < def->minArgs) {
        auto& diag = context.addDiag(diag::TooFewArguments, syntax.sourceRange());
        diag << syntax.name.valueText();
        diag << def->minArgs << actualArgs.size();
        return;
    }

    if (actualArgs.size() > formalArgs.size()) {
        auto& diag = context.addDiag(diag::TooManyArguments, syntax.sourceRange());
        diag << syntax.name.valueText();
        diag << formalArgs.size();
        diag << actualArgs.size();
        return;
    }

    SmallVector<Arg> argBuf;
    for (size_t i = 0; i < actualArgs.size(); i++) {
        auto& formal = formalArgs[i];
        auto& actual = *actualArgs[i];
        if (actual.kind == SyntaxKind::EmptyTimingCheckArg) {
            if (i < def->minArgs)
                context.addDiag(diag::EmptyArgNotAllowed, actualArgs[i]->sourceRange());
            argBuf.emplace_back();
            continue;
        }

        if (actual.kind == SyntaxKind::TimingCheckEventArg &&
            formal.kind != SystemTimingCheckArgDef::Event) {
            context.addDiag(diag::TimingCheckEventNotAllowed, actual.sourceRange());
            argBuf.emplace_back();
            continue;
        }

        switch (formal.kind) {
            case SystemTimingCheckArgDef::Limit: {
                auto& expr = Expression::bind(*actual.as<ExpressionTimingCheckArgSyntax>().expr,
                                              context);
                argBuf.emplace_back(expr);

                auto val = context.eval(expr);
                if (val && formal.requirePositive) {
                    if ((val.isInteger() && val.integer().isSigned() &&
                         val.integer().isNegative()) ||
                        (val.isReal() && val.real() < 0.0) ||
                        (val.isShortReal() && val.shortReal() < 0.0f)) {
                        context.addDiag(diag::NegativeTimingLimit, expr.sourceRange) << val;
                    }
                }
                break;
            }
            case SystemTimingCheckArgDef::Condition: {
                auto& expr = Expression::bind(*actual.as<ExpressionTimingCheckArgSyntax>().expr,
                                              context);
                context.requireBooleanConvertible(expr);
                argBuf.emplace_back(expr);
                break;
            }
            case SystemTimingCheckArgDef::Notifier: {
                // Needs to be a simple identifier, referencing an integral lvalue
                auto& exprSyntax = *actual.as<ExpressionTimingCheckArgSyntax>().expr;
                if (exprSyntax.kind != SyntaxKind::IdentifierName) {
                    context.addDiag(diag::InvalidTimingCheckNotifierArg, actual.sourceRange());
                    argBuf.emplace_back();
                    break;
                }

                ASTContext nonContinuous = context;
                nonContinuous.flags &= ~ASTFlags::NonProcedural;

                auto& expr = Expression::bindLValue(exprSyntax, comp.getLogicType(),
                                                    exprSyntax.getFirstToken().location(),
                                                    nonContinuous, /* isInout */ false);
                argBuf.emplace_back(expr);
                break;
            }
            case SystemTimingCheckArgDef::Event:
                if (actual.kind == SyntaxKind::ExpressionTimingCheckArg) {
                    auto expr = bindTerminal(*actual.as<ExpressionTimingCheckArgSyntax>().expr,
                                             SpecifyBlockSymbol::SpecifyTerminalDir::Both,
                                             parentParent, context);
                    if (!expr)
                        argBuf.emplace_back();
                    else
                        argBuf.emplace_back(*expr);
                }
                else {
                    auto& eventArg = actual.as<TimingCheckEventArgSyntax>();
                    auto expr = bindTerminal(*eventArg.terminal,
                                             SpecifyBlockSymbol::SpecifyTerminalDir::Both,
                                             parentParent, context);

                    const Expression* condition = nullptr;
                    if (eventArg.condition) {
                        condition = &Expression::bind(*eventArg.condition->expr, context);
                        context.requireBooleanConvertible(*condition);
                    }

                    auto edge = SemanticFacts::getEdgeKind(eventArg.edge.kind);

                    SmallVector<EdgeDescriptor> edgeDescriptors;
                    if (eventArg.controlSpecifier) {
                        for (auto descSyntax : eventArg.controlSpecifier->descriptors) {
                            auto t1 = descSyntax->t1.rawText();
                            auto t2 = descSyntax->t2.rawText();
                            if (t1.length() + t2.length() != 2)
                                continue;

                            EdgeDescriptor desc;
                            memcpy(desc.data(), t1.data(), t1.length());
                            if (!t2.empty())
                                memcpy(desc.data() + t1.length(), t2.data(), t2.length());

                            edgeDescriptors.push_back(desc);
                        }
                    }

                    argBuf.emplace_back(*expr, condition, edge, edgeDescriptors.copy(comp));
                }

                if (formal.requireEdge && argBuf.back().expr) {
                    auto edge = argBuf.back().edge;
                    if (edge == EdgeKind::None) {
                        context.addDiag(diag::TimingCheckEventEdgeRequired,
                                        argBuf.back().expr->sourceRange)
                            << syntax.name.valueText();
                    }
                    else if (def->kind == SystemTimingCheckKind::NoChange &&
                             edge == EdgeKind::BothEdges) {
                        context.addDiag(diag::NoChangeEdgeRequired,
                                        actual.as<TimingCheckEventArgSyntax>().edge.range());
                    }
                }
                break;
            case SystemTimingCheckArgDef::DelayedRef: {
                SLANG_ASSERT(formal.signalRef >= 0 && formal.signalRef < int(i));
                auto signalExpr = argBuf[size_t(formal.signalRef)].expr;
                if (!signalExpr) {
                    argBuf.emplace_back();
                    break;
                }

                auto& exprSyntax = *actual.as<ExpressionTimingCheckArgSyntax>().expr;
                auto& expr = Expression::bindLValue(exprSyntax, *signalExpr->type,
                                                    exprSyntax.getFirstToken().location(), context,
                                                    /* isInout */ false);
                argBuf.emplace_back(expr);
                break;
            }
        }
    }

    args = argBuf.copy(comp);
}